

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O1

Ch * __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (this->stack_).stackEnd_;
  pcVar3 = (this->stack_).stackTop_;
  if (pcVar2 == pcVar3 || (long)pcVar2 - (long)pcVar3 < 0) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(&this->stack_,1);
  }
  pcVar2 = (this->stack_).stackTop_;
  (this->stack_).stackTop_ = pcVar2 + 1;
  *pcVar2 = '\0';
  ppcVar1 = &(this->stack_).stackTop_;
  *ppcVar1 = *ppcVar1 + -1;
  return (this->stack_).stack_;
}

Assistant:

const Ch* GetString() const {
        // Push and pop a null terminator. This is safe.
        *stack_.template Push<Ch>() = '\0';
        stack_.template Pop<Ch>(1);

        return stack_.template Bottom<Ch>();
    }